

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection2.c
# Opt level: O3

void ssh2channel_initiate_close(SshChannel *sc,char *err)

{
  char *reason;
  
  if (err == (char *)0x0) {
    reason = (char *)0x0;
  }
  else {
    reason = dupprintf("due to local error: %s");
  }
  ssh2_channel_close_local((ssh2_channel *)(sc + -0xb),reason);
  safefree(reason);
  *(undefined1 *)((long)&sc[-10].cl + 4) = 0;
  ssh2_channel_check_close((ssh2_channel *)(sc + -0xb));
  return;
}

Assistant:

static void ssh2channel_initiate_close(SshChannel *sc, const char *err)
{
    struct ssh2_channel *c = container_of(sc, struct ssh2_channel, sc);
    char *reason;

    reason = err ? dupprintf("due to local error: %s", err) : NULL;
    ssh2_channel_close_local(c, reason);
    sfree(reason);
    c->pending_eof = false;   /* this will confuse a zombie channel */

    ssh2_channel_check_close(c);
}